

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcSat.c
# Opt level: O0

Vec_Int_t * Abc_NtkGetCiSatVarNums(Abc_Ntk_t *pNtk)

{
  int iVar1;
  Vec_Int_t *p;
  Abc_Obj_t *pAVar2;
  int local_24;
  int i;
  Abc_Obj_t *pObj;
  Vec_Int_t *vCiIds;
  Abc_Ntk_t *pNtk_local;
  
  iVar1 = Abc_NtkCiNum(pNtk);
  p = Vec_IntAlloc(iVar1);
  for (local_24 = 0; iVar1 = Abc_NtkCiNum(pNtk), local_24 < iVar1; local_24 = local_24 + 1) {
    pAVar2 = Abc_NtkCi(pNtk,local_24);
    Vec_IntPush(p,(pAVar2->field_6).iTemp);
  }
  return p;
}

Assistant:

Vec_Int_t * Abc_NtkGetCiSatVarNums( Abc_Ntk_t * pNtk )
{
    Vec_Int_t * vCiIds;
    Abc_Obj_t * pObj;
    int i;
    vCiIds = Vec_IntAlloc( Abc_NtkCiNum(pNtk) );
    Abc_NtkForEachCi( pNtk, pObj, i )
        Vec_IntPush( vCiIds, (int)(ABC_PTRINT_T)pObj->pCopy );
    return vCiIds;
}